

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O0

void make_level_set3(vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *tri,
                    vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *x,Vec3f *origin,
                    float dx,int ni,int nj,int nk,Array3f *phi,int exact_band)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference a_00;
  float *pfVar7;
  int *piVar8;
  int in_ECX;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *in_RSI;
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec3f *x1;
  Vec3f *x3;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int in_stack_00000010;
  int i_1;
  int total_count;
  int j_2;
  int k_2;
  uint pass;
  int i_interval;
  double fi;
  double c;
  double b;
  double a;
  int j_1;
  int k_1;
  float d;
  Vec3f gx;
  int i;
  int j;
  int k;
  int k1;
  int k0;
  int j1;
  int j0;
  int i1;
  int i0;
  double fkr;
  double fjr;
  double fir;
  double fkq;
  double fjq;
  double fiq;
  double fkp;
  double fjp;
  double fip;
  uint r;
  uint q;
  uint p;
  uint t;
  Vec3f ijkmax;
  Vec3f ijkmin;
  Array3i intersection_count;
  Array3i closest_tri;
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc44;
  int in_stack_fffffffffffffc48;
  float in_stack_fffffffffffffc4c;
  Array3<float,_Array1<float>_> *in_stack_fffffffffffffc50;
  double *in_stack_fffffffffffffc58;
  double in_stack_fffffffffffffc60;
  int *in_stack_fffffffffffffc68;
  int *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffca8;
  float in_stack_fffffffffffffcac;
  Vec3f *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  uint in_stack_fffffffffffffcbc;
  Array3f *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  float in_stack_fffffffffffffccc;
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *in_stack_fffffffffffffcd0;
  const_reference in_stack_fffffffffffffcf0;
  float in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd88;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  uint local_178;
  ulong local_168;
  double local_160;
  ulong local_158;
  float local_14c;
  int local_148;
  Vec<3U,_float> local_140;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  float local_11c;
  int local_118;
  int local_114;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  Vec<3U,_float> local_b4;
  Vec<3U,_float> local_a8 [2];
  undefined4 local_8c;
  undefined4 local_5c;
  float local_2c;
  int local_28;
  int local_24;
  int local_20;
  float local_1c;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *local_10;
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_XMM0_Da;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Array3<float,_Array1<float>_>::resize
            (in_stack_fffffffffffffc50,(int)in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc44);
  local_2c = (float)(local_20 + local_24 + local_28) * local_1c;
  Array3<float,_Array1<float>_>::assign
            ((Array3<float,_Array1<float>_> *)
             CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
             (float *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_5c = 0xffffffff;
  Array3<int,_Array1<int>_>::Array3
            ((Array3<int,_Array1<int>_> *)in_stack_fffffffffffffc50,(int)in_stack_fffffffffffffc4c,
             in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,
             (int *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_8c = 0;
  Array3<int,_Array1<int>_>::Array3
            ((Array3<int,_Array1<int>_> *)in_stack_fffffffffffffc50,(int)in_stack_fffffffffffffc4c,
             in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,
             (int *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  Vec<3U,_float>::Vec(local_a8);
  Vec<3U,_float>::Vec(&local_b4);
  for (local_b8 = 0; uVar5 = (ulong)local_b8,
      sVar6 = std::vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>::size
                        (local_8), uVar5 < sVar6; local_b8 = local_b8 + 1) {
    a_00 = std::vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>::operator[]
                     (local_8,(ulong)local_b8);
    assign<3u,unsigned_int>(a_00,&local_bc,&local_c0,&local_c4);
    std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
              (local_10,(ulong)local_bc);
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    fVar11 = *pfVar7;
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    local_d0 = ((double)fVar11 - (double)*pfVar7) / (double)local_1c;
    std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
              (local_10,(ulong)local_bc);
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    fVar11 = *pfVar7;
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    local_d8 = ((double)fVar11 - (double)*pfVar7) / (double)local_1c;
    std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
              (local_10,(ulong)local_bc);
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    fVar11 = *pfVar7;
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    local_e0 = ((double)fVar11 - (double)*pfVar7) / (double)local_1c;
    std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
              (local_10,(ulong)local_c0);
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    fVar11 = *pfVar7;
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    local_e8 = ((double)fVar11 - (double)*pfVar7) / (double)local_1c;
    std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
              (local_10,(ulong)local_c0);
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    fVar11 = *pfVar7;
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    local_f0 = ((double)fVar11 - (double)*pfVar7) / (double)local_1c;
    std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
              (local_10,(ulong)local_c0);
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    fVar11 = *pfVar7;
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    local_f8 = ((double)fVar11 - (double)*pfVar7) / (double)local_1c;
    std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
              (local_10,(ulong)local_c4);
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    fVar11 = *pfVar7;
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    local_100 = ((double)fVar11 - (double)*pfVar7) / (double)local_1c;
    std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
              (local_10,(ulong)local_c4);
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    fVar11 = *pfVar7;
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    local_108 = ((double)fVar11 - (double)*pfVar7) / (double)local_1c;
    std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
              (local_10,(ulong)local_c4);
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    auVar14._0_8_ = (Vec3f *)(double)*pfVar7;
    pfVar7 = Vec<3U,_float>::operator[]
                       ((Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                        in_stack_fffffffffffffc3c);
    local_110 = ((double)auVar14._0_8_ - (double)*pfVar7) / (double)local_1c;
    x1 = (Vec3f *)min<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                              (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                              5.39916914037898e-318);
    iVar2 = clamp<int>((int)(double)x1 - in_stack_00000010,0,local_20 + -1);
    local_114 = iVar2;
    x3 = (Vec3f *)max<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                              (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                              5.39968296865065e-318);
    local_118 = clamp<int>((int)(double)x3 + 1 + in_stack_00000010,0,local_20 + -1);
    auVar16._0_8_ =
         min<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     5.40022644086108e-318);
    local_11c = (float)clamp<int>((int)auVar16._0_8_ - in_stack_00000010,0,local_24 + -1);
    auVar16._0_8_ =
         max<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     5.40074026913275e-318);
    local_120 = clamp<int>((int)auVar16._0_8_ + 1 + in_stack_00000010,0,local_24 + -1);
    auVar16._0_8_ =
         min<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     5.40128374134318e-318);
    local_124 = clamp<int>((int)auVar16._0_8_ - in_stack_00000010,0,local_28 + -1);
    auVar16._0_8_ =
         max<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     5.40179756961485e-318);
    local_128 = clamp<int>((int)auVar16._0_8_ + 1 + in_stack_00000010,0,local_28 + -1);
    for (local_12c = local_124; local_12c <= local_128; local_12c = local_12c + 1) {
      for (local_130 = (int)local_11c; local_130 <= local_120; local_130 = local_130 + 1) {
        for (local_134 = local_114; fVar11 = local_1c, local_134 <= local_118;
            local_134 = local_134 + 1) {
          fVar9 = (float)local_134;
          pfVar7 = Vec<3U,_float>::operator[]
                             ((Vec<3U,_float> *)
                              CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                              in_stack_fffffffffffffc3c);
          fVar10 = local_1c;
          auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar9),
                                    ZEXT416((uint)*pfVar7));
          fVar9 = (float)local_130;
          pfVar7 = Vec<3U,_float>::operator[]
                             ((Vec<3U,_float> *)
                              CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                              in_stack_fffffffffffffc3c);
          fVar11 = local_1c;
          auVar19 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar9),
                                    ZEXT416((uint)*pfVar7));
          fVar10 = (float)local_12c;
          pfVar7 = Vec<3U,_float>::operator[]
                             ((Vec<3U,_float> *)
                              CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                              in_stack_fffffffffffffc3c);
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar10),
                                    ZEXT416((uint)*pfVar7));
          Vec<3U,_float>::Vec(&local_140,auVar18._0_4_,auVar19._0_4_,auVar20._0_4_);
          std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
                    (local_10,(ulong)local_bc);
          in_stack_fffffffffffffcf0 =
               std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
                         (local_10,(ulong)local_c0);
          std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::operator[]
                    (local_10,(ulong)local_c4);
          fVar11 = point_triangle_distance
                             (auVar14._0_8_,x1,(Vec3f *)CONCAT44(iVar2,in_stack_fffffffffffffd88),x3
                             );
          in_stack_fffffffffffffcf8 = fVar11;
          pfVar7 = Array3<float,_Array1<float>_>::operator()
                             (in_stack_fffffffffffffc50,(int)in_stack_fffffffffffffc4c,
                              in_stack_fffffffffffffc48,in_stack_fffffffffffffc44);
          if (fVar11 < *pfVar7) {
            in_stack_fffffffffffffcd0 =
                 (vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *)
                 Array3<float,_Array1<float>_>::operator()
                           (in_stack_fffffffffffffc50,(int)in_stack_fffffffffffffc4c,
                            in_stack_fffffffffffffc48,in_stack_fffffffffffffc44);
            *(float *)&(in_stack_fffffffffffffcd0->
                       super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start = fVar11;
            in_stack_fffffffffffffcbc = local_b8;
            in_stack_fffffffffffffcc0 =
                 (Array3f *)
                 Array3<int,_Array1<int>_>::operator()
                           ((Array3<int,_Array1<int>_> *)in_stack_fffffffffffffc50,
                            (int)in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,
                            in_stack_fffffffffffffc44);
            in_stack_fffffffffffffcc0->ni = in_stack_fffffffffffffcbc;
            in_stack_fffffffffffffccc = fVar11;
          }
        }
      }
    }
    auVar14._0_8_ =
         (Vec3f *)min<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                              (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                              5.4071730038416e-318);
    auVar14._8_56_ = extraout_var;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar14._0_8_;
    auVar18 = vroundsd_avx(auVar14._0_16_,auVar18,10);
    in_stack_fffffffffffffcac = (float)clamp<int>((int)auVar18._0_8_,0,local_24 + -1);
    local_11c = in_stack_fffffffffffffcac;
    auVar15._0_8_ =
         max<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     5.4076127222664e-318);
    auVar15._8_56_ = extraout_var_00;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = auVar15._0_8_;
    auVar18 = vroundsd_avx(auVar15._0_16_,auVar19,9);
    iVar2 = clamp<int>((int)auVar18._0_8_,0,local_24 + -1);
    local_120 = iVar2;
    auVar16._0_8_ =
         min<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     5.4080524406912e-318);
    auVar16._8_56_ = extraout_var_01;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = auVar16._0_8_;
    auVar18 = vroundsd_avx(auVar16._0_16_,auVar20,10);
    iVar3 = clamp<int>((int)auVar18._0_8_,0,local_28 + -1);
    local_124 = iVar3;
    auVar17._0_8_ =
         max<double>((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (double)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     5.408492159116e-318);
    auVar17._8_56_ = extraout_var_02;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auVar17._0_8_;
    auVar18 = vroundsd_avx(auVar17._0_16_,auVar21,9);
    iVar4 = clamp<int>((int)auVar18._0_8_,0,local_28 + -1);
    local_128 = iVar4;
    for (local_148 = local_124; local_148 <= local_128; local_148 = local_148 + 1) {
      for (local_14c = local_11c; (int)local_14c <= local_120;
          local_14c = (float)((int)local_14c + 1)) {
        bVar1 = point_in_triangle_2d
                          ((double)CONCAT44(iVar2,in_stack_fffffffffffffc98),auVar16._0_8_,
                           (double)CONCAT44(iVar3,in_stack_fffffffffffffc88),auVar17._0_8_,
                           (double)CONCAT44(iVar4,in_stack_fffffffffffffc78),
                           (double)in_stack_fffffffffffffc70,(double)in_stack_fffffffffffffc68,
                           in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                           (double *)in_stack_fffffffffffffc50,
                           (double *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        in_stack_fffffffffffffc78 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc78);
        if (bVar1) {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_158;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_d0;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_160 * local_e8;
          auVar18 = vfmadd213sd_fma(auVar25,auVar12,auVar22);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = local_168;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_100;
          auVar18 = vfmadd213sd_fma(auVar13,auVar23,auVar18);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = auVar18._0_8_;
          auVar18 = vroundsd_avx(auVar18,auVar24,10);
          if ((int)auVar18._0_8_ < 0) {
            in_stack_fffffffffffffc70 =
                 Array3<int,_Array1<int>_>::operator()
                           ((Array3<int,_Array1<int>_> *)in_stack_fffffffffffffc50,
                            (int)in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,
                            in_stack_fffffffffffffc44);
            *in_stack_fffffffffffffc70 = *in_stack_fffffffffffffc70 + 1;
          }
          else if ((int)auVar18._0_8_ < local_20) {
            in_stack_fffffffffffffc68 =
                 Array3<int,_Array1<int>_>::operator()
                           ((Array3<int,_Array1<int>_> *)in_stack_fffffffffffffc50,
                            (int)in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,
                            in_stack_fffffffffffffc44);
            *in_stack_fffffffffffffc68 = *in_stack_fffffffffffffc68 + 1;
          }
        }
      }
    }
    in_stack_fffffffffffffcb0 = auVar14._0_8_;
  }
  for (local_178 = 0; local_178 < 2; local_178 = local_178 + 1) {
    sweep(in_stack_fffffffffffffcd0,
          (vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)
          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0,
          (Array3i *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
          in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8,
          (int)in_stack_fffffffffffffcf0,(int)in_stack_fffffffffffffcf8);
    sweep(in_stack_fffffffffffffcd0,
          (vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)
          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0,
          (Array3i *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
          in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8,
          (int)in_stack_fffffffffffffcf0,(int)in_stack_fffffffffffffcf8);
    sweep(in_stack_fffffffffffffcd0,
          (vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)
          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0,
          (Array3i *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
          in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8,
          (int)in_stack_fffffffffffffcf0,(int)in_stack_fffffffffffffcf8);
    sweep(in_stack_fffffffffffffcd0,
          (vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)
          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0,
          (Array3i *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
          in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8,
          (int)in_stack_fffffffffffffcf0,(int)in_stack_fffffffffffffcf8);
    sweep(in_stack_fffffffffffffcd0,
          (vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)
          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0,
          (Array3i *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
          in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8,
          (int)in_stack_fffffffffffffcf0,(int)in_stack_fffffffffffffcf8);
    sweep(in_stack_fffffffffffffcd0,
          (vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)
          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0,
          (Array3i *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
          in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8,
          (int)in_stack_fffffffffffffcf0,(int)in_stack_fffffffffffffcf8);
    sweep(in_stack_fffffffffffffcd0,
          (vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)
          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0,
          (Array3i *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
          in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8,
          (int)in_stack_fffffffffffffcf0,(int)in_stack_fffffffffffffcf8);
    sweep(in_stack_fffffffffffffcd0,
          (vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)
          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0,
          (Array3i *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
          in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8,
          (int)in_stack_fffffffffffffcf0,(int)in_stack_fffffffffffffcf8);
  }
  for (local_17c = 0; local_17c < local_28; local_17c = local_17c + 1) {
    for (local_180 = 0; local_180 < local_24; local_180 = local_180 + 1) {
      local_184 = 0;
      for (local_188 = 0; local_188 < local_20; local_188 = local_188 + 1) {
        piVar8 = Array3<int,_Array1<int>_>::operator()
                           ((Array3<int,_Array1<int>_> *)in_stack_fffffffffffffc50,
                            (int)in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48,
                            in_stack_fffffffffffffc44);
        local_184 = *piVar8 + local_184;
        if (local_184 % 2 == 1) {
          pfVar7 = Array3<float,_Array1<float>_>::operator()
                             (in_stack_fffffffffffffc50,(int)in_stack_fffffffffffffc4c,
                              in_stack_fffffffffffffc48,in_stack_fffffffffffffc44);
          in_stack_fffffffffffffc4c = -*pfVar7;
          in_stack_fffffffffffffc50 =
               (Array3<float,_Array1<float>_> *)
               Array3<float,_Array1<float>_>::operator()
                         (in_stack_fffffffffffffc50,(int)in_stack_fffffffffffffc4c,
                          in_stack_fffffffffffffc48,in_stack_fffffffffffffc44);
          in_stack_fffffffffffffc50->ni = (int)in_stack_fffffffffffffc4c;
        }
      }
    }
  }
  Array3<int,_Array1<int>_>::~Array3((Array3<int,_Array1<int>_> *)0x10ba75);
  Array3<int,_Array1<int>_>::~Array3((Array3<int,_Array1<int>_> *)0x10ba82);
  return;
}

Assistant:

void make_level_set3(const std::vector<Vec3ui> &tri, const std::vector<Vec3f> &x,
                     const Vec3f &origin, float dx, int ni, int nj, int nk,
                     Array3f &phi, const int exact_band)
{
   phi.resize(ni, nj, nk);
   phi.assign((ni+nj+nk)*dx); // upper bound on distance
   Array3i closest_tri(ni, nj, nk, -1);
   Array3i intersection_count(ni, nj, nk, 0); // intersection_count(i,j,k) is # of tri intersections in (i-1,i]x{j}x{k}
   // we begin by initializing distances near the mesh, and figuring out intersection counts
   Vec3f ijkmin, ijkmax;
   for(unsigned int t=0; t<tri.size(); ++t){
     unsigned int p, q, r; assign(tri[t], p, q, r);
     // coordinates in grid to high precision
      double fip=((double)x[p][0]-origin[0])/dx, fjp=((double)x[p][1]-origin[1])/dx, fkp=((double)x[p][2]-origin[2])/dx;
      double fiq=((double)x[q][0]-origin[0])/dx, fjq=((double)x[q][1]-origin[1])/dx, fkq=((double)x[q][2]-origin[2])/dx;
      double fir=((double)x[r][0]-origin[0])/dx, fjr=((double)x[r][1]-origin[1])/dx, fkr=((double)x[r][2]-origin[2])/dx;
      // do distances nearby
      int i0=clamp(int(min(fip,fiq,fir))-exact_band, 0, ni-1), i1=clamp(int(max(fip,fiq,fir))+exact_band+1, 0, ni-1);
      int j0=clamp(int(min(fjp,fjq,fjr))-exact_band, 0, nj-1), j1=clamp(int(max(fjp,fjq,fjr))+exact_band+1, 0, nj-1);
      int k0=clamp(int(min(fkp,fkq,fkr))-exact_band, 0, nk-1), k1=clamp(int(max(fkp,fkq,fkr))+exact_band+1, 0, nk-1);
      for(int k=k0; k<=k1; ++k) for(int j=j0; j<=j1; ++j) for(int i=i0; i<=i1; ++i){
         Vec3f gx(i*dx+origin[0], j*dx+origin[1], k*dx+origin[2]);
         float d=point_triangle_distance(gx, x[p], x[q], x[r]);
         if(d<phi(i,j,k)){
            phi(i,j,k)=d;
            closest_tri(i,j,k)=t;
         }
      }
      // and do intersection counts
      j0=clamp((int)std::ceil(min(fjp,fjq,fjr)), 0, nj-1);
      j1=clamp((int)std::floor(max(fjp,fjq,fjr)), 0, nj-1);
      k0=clamp((int)std::ceil(min(fkp,fkq,fkr)), 0, nk-1);
      k1=clamp((int)std::floor(max(fkp,fkq,fkr)), 0, nk-1);
      for(int k=k0; k<=k1; ++k) for(int j=j0; j<=j1; ++j){
         double a, b, c;
         if(point_in_triangle_2d(j, k, fjp, fkp, fjq, fkq, fjr, fkr, a, b, c)){
            double fi=a*fip+b*fiq+c*fir; // intersection i coordinate
            int i_interval=int(std::ceil(fi)); // intersection is in (i_interval-1,i_interval]
            if(i_interval<0) ++intersection_count(0, j, k); // we enlarge the first interval to include everything to the -x direction
            else if(i_interval<ni) ++intersection_count(i_interval,j,k);
            // we ignore intersections that are beyond the +x side of the grid
         }
      }
   }
   // and now we fill in the rest of the distances with fast sweeping
   for(unsigned int pass=0; pass<2; ++pass){
      sweep(tri, x, phi, closest_tri, origin, dx, +1, +1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, -1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, +1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, -1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, -1, +1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, +1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, +1, -1, -1);
      sweep(tri, x, phi, closest_tri, origin, dx, -1, +1, +1);
   }
   // then figure out signs (inside/outside) from intersection counts
   for(int k=0; k<nk; ++k) for(int j=0; j<nj; ++j){
      int total_count=0;
      for(int i=0; i<ni; ++i){
         total_count+=intersection_count(i,j,k);
         if(total_count%2==1){ // if parity of intersections so far is odd,
            phi(i,j,k)=-phi(i,j,k); // we are inside the mesh
         }
      }
   }
}